

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O3

void __thiscall
ccel::handler_pool<test_handler_class>::handler_pool
          (handler_pool<test_handler_class> *this,size_t pool_size,size_t handler_limit)

{
  (this->super_object_pool<test_handler_class,_boost::default_user_allocator_new_delete>).
  super_pool<boost::default_user_allocator_new_delete>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (this->super_object_pool<test_handler_class,_boost::default_user_allocator_new_delete>).
  super_pool<boost::default_user_allocator_new_delete>.list.ptr = (char *)0x0;
  (this->super_object_pool<test_handler_class,_boost::default_user_allocator_new_delete>).
  super_pool<boost::default_user_allocator_new_delete>.list.sz = 0;
  (this->super_object_pool<test_handler_class,_boost::default_user_allocator_new_delete>).
  super_pool<boost::default_user_allocator_new_delete>.requested_size = 4;
  (this->super_object_pool<test_handler_class,_boost::default_user_allocator_new_delete>).
  super_pool<boost::default_user_allocator_new_delete>.next_size = 0x20;
  (this->super_object_pool<test_handler_class,_boost::default_user_allocator_new_delete>).
  super_pool<boost::default_user_allocator_new_delete>.start_size = 0x20;
  (this->super_object_pool<test_handler_class,_boost::default_user_allocator_new_delete>).
  super_pool<boost::default_user_allocator_new_delete>.max_size = 0;
  (this->super_enable_shared_from_this<ccel::handler_pool<test_handler_class>_>).weak_this_.px =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<ccel::handler_pool<test_handler_class>_>).weak_this_.pn.pi_ =
       (sp_counted_base *)0x0;
  boost::asio::io_context::io_context(&this->_io_service);
  boost::thread_group::thread_group(&this->_workers_group);
  this->_pool_size = 0;
  this->_handler_limit = 0;
  return;
}

Assistant:

handler_pool(std::size_t pool_size = 0, std::size_t handler_limit = 0)
      : _pool_size(0), _handler_limit(0){}